

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::WatWriter::~WatWriter(WatWriter *this)

{
  pointer pLVar1;
  allocator<wabt::(anonymous_namespace)::Label> *extraout_RDX;
  long lVar2;
  
  lVar2 = 0xf0;
  do {
    std::_Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::~_Vector_base
              ((_Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_> *)
               ((long)&this->options_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0x78);
  std::
  _Rb_tree<std::pair<wabt::ExternalKind,_unsigned_int>,_std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>,_std::_Select1st<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>,_std::less<std::pair<wabt::ExternalKind,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>_>
  ::~_Rb_tree(&(this->inline_export_map_)._M_t);
  std::
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ::~vector(&this->expr_tree_stack_);
  std::_Destroy<wabt::(anonymous_namespace)::Label*,wabt::(anonymous_namespace)::Label>
            ((this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish,extraout_RDX);
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1);
    return;
  }
  return;
}

Assistant:

WatWriter(Stream* stream, const WriteWatOptions& options)
      : options_(options), stream_(stream) {}